

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest03VerifyingNameChaining_::
Section3ValidNameChainingUIDsTest6<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section3ValidNameChainingUIDsTest6
          (Section3ValidNameChainingUIDsTest6<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section3ValidNameChainingUIDsTest6<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~Section3ValidNameChainingUIDsTest6(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest03VerifyingNameChaining,
                     Section3ValidNameChainingUIDsTest6) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "UIDCACert",
                               "ValidNameUIDsTest6EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "UIDCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.3.6";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}